

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O2

Attachment *
deqp::gls::fboc::details::makeAttachment
          (GLenum bufType,ImageFormat format,GLsizei width,GLsizei height,FboBuilder *builder)

{
  GLuint GVar1;
  Image *pIVar2;
  Renderbuffer *rbCfg;
  RenderbufferAttachment *pRVar3;
  Texture *texCfg;
  
  pIVar2 = makeImage(bufType,format,width,height,builder);
  if (pIVar2 == (Image *)0x0) {
    pRVar3 = (RenderbufferAttachment *)0x0;
  }
  else {
    rbCfg = (Renderbuffer *)
            __dynamic_cast(pIVar2,&FboUtil::config::Image::typeinfo,
                           &FboUtil::config::Renderbuffer::typeinfo,0);
    if (rbCfg == (Renderbuffer *)0x0) {
      texCfg = (Texture *)
               __dynamic_cast(pIVar2,&FboUtil::config::Image::typeinfo,
                              &FboUtil::config::Texture2D::typeinfo,0);
      if (texCfg == (Texture *)0x0) {
        return (Attachment *)0x0;
      }
      GVar1 = FboUtil::FboBuilder::glCreateTexture(builder,texCfg);
      pRVar3 = (RenderbufferAttachment *)
               FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::TextureFlatAttachment>
                         (builder);
      *(undefined4 *)&pRVar3->field_0x14 = 0xde1;
    }
    else {
      GVar1 = FboUtil::FboBuilder::glCreateRbo(builder,rbCfg);
      pRVar3 = FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::RenderbufferAttachment>
                         (builder);
    }
    (pRVar3->super_Attachment).imageName = GVar1;
  }
  return &pRVar3->super_Attachment;
}

Assistant:

Attachment* makeAttachment (GLenum bufType, ImageFormat format,
							GLsizei width, GLsizei height, FboBuilder& builder)
{
	Image* const imgCfg = makeImage (bufType, format, width, height, builder);
	Attachment* att = DE_NULL;
	GLuint img = 0;

	if (Renderbuffer* rboCfg = dynamic_cast<Renderbuffer*>(imgCfg))
	{
		img = builder.glCreateRbo(*rboCfg);
		att = &builder.makeConfig<RenderbufferAttachment>();
	}
	else if (Texture2D* texCfg = dynamic_cast<Texture2D*>(imgCfg))
	{
		img = builder.glCreateTexture(*texCfg);
		TextureFlatAttachment& texAtt = builder.makeConfig<TextureFlatAttachment>();
		texAtt.texTarget = GL_TEXTURE_2D;
		att = &texAtt;
	}
	else
	{
		DE_ASSERT(imgCfg == DE_NULL);
		return DE_NULL;
	}
	att->imageName = img;
	return att;
}